

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseLimits(WastParser *this,Limits *out_limits)

{
  bool bVar1;
  Result RVar2;
  Limits *out_limits_local;
  WastParser *this_local;
  
  RVar2 = ParseNat(this,&out_limits->initial,(bool)(out_limits->is_64 & 1));
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    bVar1 = PeekMatch(this,Last_Literal,0);
    if (bVar1) {
      RVar2 = ParseNat(this,&out_limits->max,(bool)(out_limits->is_64 & 1));
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      out_limits->has_max = true;
    }
    else {
      out_limits->has_max = false;
    }
    bVar1 = Match(this,Shared);
    if (bVar1) {
      out_limits->is_shared = true;
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseLimits(Limits* out_limits) {
  WABT_TRACE(ParseLimits);

  CHECK_RESULT(ParseNat(&out_limits->initial, out_limits->is_64));
  if (PeekMatch(TokenType::Nat)) {
    CHECK_RESULT(ParseNat(&out_limits->max, out_limits->is_64));
    out_limits->has_max = true;
  } else {
    out_limits->has_max = false;
  }

  if (Match(TokenType::Shared)) {
    out_limits->is_shared = true;
  }

  return Result::Ok;
}